

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

int mg_map_equal(mg_map *lhs,mg_map *rhs)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar1 = lhs->size;
  uVar3 = 0;
  if (uVar1 == rhs->size) {
    uVar2 = 0;
    do {
      uVar5 = uVar2;
      if (uVar1 == uVar5) break;
      iVar4 = mg_string_equal(lhs->keys[uVar5],rhs->keys[uVar5]);
      if (iVar4 == 0) break;
      iVar4 = mg_value_equal(lhs->values[uVar5],rhs->values[uVar5]);
      uVar2 = uVar5 + 1;
    } while (iVar4 != 0);
    uVar3 = (uint)(uVar1 <= uVar5);
  }
  return uVar3;
}

Assistant:

int mg_map_equal(const mg_map *lhs, const mg_map *rhs) {
  if (lhs->size != rhs->size) {
    return 0;
  }
  for (uint32_t i = 0; i < lhs->size; ++i) {
    if (!mg_string_equal(lhs->keys[i], rhs->keys[i])) return 0;
    if (!mg_value_equal(lhs->values[i], rhs->values[i])) return 0;
  }
  return 1;
}